

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O0

bool __thiscall node::runPrepare(node *this)

{
  char cVar1;
  int iVar2;
  bool bVar3;
  bool bVar4;
  __type_conflict _Var5;
  size_type sVar6;
  reference pvVar7;
  char *pcVar8;
  reference this_00;
  reference pvVar9;
  pointer __lhs;
  ulong uVar10;
  long lVar11;
  int local_1a0;
  char ch_2;
  int j_3;
  char ch_1;
  int j_2;
  int remove_count;
  bool space;
  uint i_2;
  _Self local_180;
  _Self local_178;
  iterator j_1;
  string local_148 [7];
  bool label_exists;
  string operand;
  int local_128;
  int local_124;
  int i_1;
  string local_100 [32];
  string local_e0 [36];
  undefined4 local_bc;
  undefined1 local_b8 [4];
  int c;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
  p;
  string tmp;
  string local_68 [7];
  char ch;
  string line;
  uint local_44;
  char local_3d;
  uint j;
  bool label;
  int8_t i;
  undefined1 local_30 [8];
  vector<int,_std::allocator<int>_> labelLines;
  node *this_local;
  
  labelLines.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)this;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_30);
  std::__cxx11::
  list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
  ::clear(&this->labels);
  sVar6 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(&this->inputCode);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::resize(&this->code,sVar6);
  for (local_3d = '\0';
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->inputCode), (ulong)(long)local_3d < sVar6; local_3d = local_3d + '\x01')
  {
    bVar3 = false;
    for (local_44 = 0;
        sVar6 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::size(&this->inputCode), local_44 < sVar6; local_44 = local_44 + 1) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->inputCode,(long)local_3d);
      std::__cxx11::string::string(local_68,(string *)pvVar7);
      pcVar8 = (char *)std::__cxx11::string::operator[]((ulong)local_68);
      cVar1 = *pcVar8;
      std::__cxx11::string::string((string *)&p.second);
      if (cVar1 == ':') {
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
        ::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char,_true>
                  ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
                    *)local_b8);
        std::__cxx11::string::substr((ulong)local_e0,(ulong)local_68);
        std::__cxx11::string::operator=((string *)local_b8,local_e0);
        std::__cxx11::string::~string(local_e0);
        p._24_1_ = local_3d;
        std::__cxx11::
        list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
        ::push_back(&this->labels,(value_type *)local_b8);
        bVar3 = true;
        std::__cxx11::string::substr((ulong)local_100,(ulong)local_68);
        local_bc = std::__cxx11::string::find_first_not_of((char *)local_100,0x11f0c4);
        std::__cxx11::string::~string(local_100);
        std::__cxx11::string::substr((ulong)&i_1,(ulong)local_68);
        pvVar7 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[](&this->code,(long)local_3d);
        std::__cxx11::string::operator=((string *)pvVar7,(string *)&i_1);
        std::__cxx11::string::~string((string *)&i_1);
        local_124 = 5;
        std::
        pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
        ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>
                 *)local_b8);
      }
      else {
        local_124 = 0;
      }
      std::__cxx11::string::~string((string *)&p.second);
      std::__cxx11::string::~string(local_68);
      if (local_124 != 0) break;
    }
    if (!bVar3) {
      pvVar7 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::operator[](&this->inputCode,(long)local_3d);
      this_00 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](&this->code,(long)local_3d);
      std::__cxx11::string::operator=((string *)this_00,(string *)pvVar7);
    }
  }
  for (local_128 = 0;
      sVar6 = std::vector<int,_std::allocator<int>_>::size
                        ((vector<int,_std::allocator<int>_> *)local_30),
      (ulong)(long)local_128 < sVar6; local_128 = local_128 + 1) {
    std::__cxx11::string::string(local_148);
    bVar3 = false;
    pvVar9 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)local_30,(long)local_128);
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->code,(long)*pvVar9);
    std::__cxx11::string::substr((ulong)&j_1,(ulong)pvVar7);
    std::__cxx11::string::operator=(local_148,(string *)&j_1);
    std::__cxx11::string::~string((string *)&j_1);
    local_178._M_node =
         (_List_node_base *)
         std::__cxx11::
         list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
         ::begin(&this->labels);
    while( true ) {
      local_180._M_node =
           (_List_node_base *)
           std::__cxx11::
           list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>_>
           ::end(&this->labels);
      bVar4 = std::operator!=(&local_178,&local_180);
      if (!bVar4) break;
      __lhs = std::
              _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>
              ::operator->(&local_178);
      _Var5 = std::operator==(&__lhs->first,
                              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              local_148);
      if (_Var5) {
        bVar3 = true;
        break;
      }
      std::
      _List_iterator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_char>_>
      ::operator++(&local_178,0);
    }
    if (!bVar3) {
      this_local._7_1_ = 0;
    }
    std::__cxx11::string::~string(local_148);
    if (!bVar3) goto LAB_0011821b;
  }
  for (remove_count = 0;
      sVar6 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&this->code), (uint)remove_count < sVar6; remove_count = remove_count + 1) {
    j_3 = 0;
    while( true ) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->code,(ulong)(uint)remove_count);
      uVar10 = std::__cxx11::string::length();
      if (uVar10 <= (ulong)(long)j_3) break;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->code,(ulong)(uint)remove_count);
      lVar11 = std::__cxx11::string::c_str();
      if (*(char *)(lVar11 + j_3) == ':') {
        this_local._7_1_ = 0;
        goto LAB_0011821b;
      }
      j_3 = j_3 + 1;
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator[](&this->code,(ulong)(uint)remove_count);
    local_1a0 = std::__cxx11::string::length();
    do {
      iVar2 = local_1a0;
      local_1a0 = iVar2 + -1;
      if (local_1a0 < 0) goto LAB_001181f7;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](&this->code,(ulong)(uint)remove_count);
      lVar11 = std::__cxx11::string::c_str();
    } while ((*(char *)(lVar11 + local_1a0) == ' ') || (*(char *)(lVar11 + local_1a0) == ','));
    pvVar7 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[](&this->code,(ulong)(uint)remove_count);
    std::__cxx11::string::erase((ulong)pvVar7,(long)iVar2);
LAB_001181f7:
  }
  this_local._7_1_ = 1;
LAB_0011821b:
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_30);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool node::runPrepare(){
  std::vector<int> labelLines;
  labels.clear();
  code.resize(inputCode.size());
  for (int8_t i = 0; i < inputCode.size(); i++){
    bool label=false;
    for(unsigned int j=0;j<inputCode.size();j++){
      string line=inputCode[i];
      char ch=line[j];
      string tmp;      
      if(ch==':'){
	std::pair<std::string, uint8_t> p;
	int c;
	p.first=line.substr(0,j);
	p.second=i;
	labels.push_back(p);
	label=true;
	c=line.substr(j+1).find_first_not_of(" ");
	code[i]=line.substr(c+j+1);
	break;
      }
    }
    if(label==false){
      code[i]=inputCode[i];
    }
  }
  for(int i=0; i<labelLines.size();i++){
    string operand;
    bool label_exists=false;
    operand=code[labelLines[i]].substr(4);
    for(list<pair<string, uint8_t> >::iterator j=labels.begin();j!=labels.end();j++){
      if(j->first==operand){
	label_exists=true;
	break;
      }
    }
    if(label_exists==false)
      return false;
  }
  for(unsigned int i=0;i<code.size();i++){
    bool space=false;
    int  remove_count=0;
    for(int j=0; j<code[i].length();j++){
      char ch=code[i].c_str()[j];
      if(ch == ' '||ch==','){
	if(space){
	  code[i].erase(j, 1);              //get rid of whitespace
	  j--;
	}
	space=true;
      }
      if(ch==':')
	return false;
      else
	space=false;
    }
    for(int j=code[i].length()-1;j>=0;j--){
      char ch=code[i].c_str()[j];
      if(ch==' '||ch==',')
	remove_count++;
      else{
	code[i].erase(j+1, remove_count);
	break;
      }
    }
  }
  return true;
}